

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

void __thiscall jessilib::object::object(object *this,string_view_type *in_str)

{
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::u8string::_M_construct<char8_t_const*>
            ((u8string *)&local_30,in_str->_M_str,in_str->_M_str + in_str->_M_len);
  std::
  variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
  ::variant<std::__cxx11::u8string,void,void,std::__cxx11::u8string,void>
            ((variant<void*,bool,long,long_double,std::__cxx11::u8string,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<jessilib::object,std::allocator<jessilib::object>>,std::map<std::__cxx11::u8string,jessilib::object,std::less<std::__cxx11::u8string>,std::allocator<std::pair<std::__cxx11::u8string_const,jessilib::object>>>>
              *)this,&local_30);
  std::__cxx11::u8string::~u8string((u8string *)&local_30);
  return;
}

Assistant:

object::object(const string_view_type& in_str)
	: m_value{ string_type{ in_str.begin(), in_str.end() } } {
	// Empty ctor body
}